

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackComponentGroup.h
# Opt level: O3

void __thiscall cmCPackComponent::~cmCPackComponent(cmCPackComponent *this)

{
  pointer ppcVar1;
  pointer pcVar2;
  pointer ppcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Directories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Files);
  ppcVar1 = (this->ReverseDependencies).
            super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar1 != (pointer)0x0) {
    operator_delete(ppcVar1,(long)(this->ReverseDependencies).
                                  super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar1
                   );
  }
  ppcVar1 = (this->Dependencies).
            super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar1 != (pointer)0x0) {
    operator_delete(ppcVar1,(long)(this->Dependencies).
                                  super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar1
                   );
  }
  pcVar2 = (this->ArchiveFile)._M_dataplus._M_p;
  paVar4 = &(this->ArchiveFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  ppcVar3 = (this->InstallationTypes).
            super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar3 != (pointer)0x0) {
    operator_delete(ppcVar3,(long)(this->InstallationTypes).
                                  super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar3
                   );
  }
  pcVar2 = (this->Description)._M_dataplus._M_p;
  paVar4 = &(this->Description).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->DisplayName)._M_dataplus._M_p;
  paVar4 = &(this->DisplayName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->Name)._M_dataplus._M_p;
  paVar4 = &(this->Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmCPackComponent() : Group(0), IsRequired(true), IsHidden(false),
                      IsDisabledByDefault(false), IsDownloaded(false),
                      TotalSize(0) { }